

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score_function_test.cc
# Opt level: O0

void __thiscall xLearn::SCORE_TEST_Create_Score_Test::TestBody(SCORE_TEST_Create_Score_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined8 in_stack_fffffffffffffe58;
  undefined1 success;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  string local_158 [8];
  char *in_stack_fffffffffffffeb0;
  AssertHelper local_138;
  Message local_130;
  AssertionResult local_128;
  string local_118;
  AssertHelper local_f8;
  Message local_f0;
  AssertionResult local_e8;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0;
  AssertionResult local_a8;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  AssertionResult local_68;
  string local_58;
  AssertHelper local_38;
  Message local_30 [3];
  AssertionResult local_18;
  
  success = (undefined1)((ulong)in_stack_fffffffffffffe58 >> 0x38);
  CreateScore(in_stack_fffffffffffffeb0);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             (bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&local_18,(AssertionResult *)"CreateScore(\"linear\") != NULL",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/score/score_function_test.cc"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    testing::Message::~Message((Message *)0x13da87);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13daff);
  CreateScore(in_stack_fffffffffffffeb0);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             (bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_68,(AssertionResult *)"CreateScore(\"fm\") != NULL",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/score/score_function_test.cc"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x13dc19);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13dc91);
  CreateScore(in_stack_fffffffffffffeb0);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             (bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)&local_a8,(AssertionResult *)"CreateScore(\"ffm\") != NULL",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/score/score_function_test.cc"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message((Message *)0x13ddab);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13de23);
  CreateScore(in_stack_fffffffffffffeb0);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             (bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)&local_e8,(AssertionResult *)"CreateScore(\"\") == NULL",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/score/score_function_test.cc"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    testing::Message::~Message((Message *)0x13df3d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13dfb5);
  CreateScore(in_stack_fffffffffffffeb0);
  this_00 = &local_128;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             SUB81((ulong)this_00 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)&local_128,
               (AssertionResult *)"CreateScore(\"unknow_name\") == NULL","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/score/score_function_test.cc"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string(local_158);
    testing::Message::~Message((Message *)0x13e0b2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13e121);
  return;
}

Assistant:

TEST(SCORE_TEST, Create_Score) {
  EXPECT_TRUE(CreateScore("linear") != NULL);
  EXPECT_TRUE(CreateScore("fm") != NULL);
  EXPECT_TRUE(CreateScore("ffm") != NULL);
  EXPECT_TRUE(CreateScore("") == NULL);
  EXPECT_TRUE(CreateScore("unknow_name") == NULL);
}